

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpCommsSS::TcpCommsSS(TcpCommsSS *this)

{
  NetworkCommsInterface *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  thread_generation in_stack_ffffffffffffffe8;
  InterfaceTypes in_stack_ffffffffffffffef;
  
  NetworkCommsInterface::NetworkCommsInterface
            (in_RDI,in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8);
  (in_RDI->super_CommsInterface)._vptr_CommsInterface = (_func_int **)&PTR__TcpCommsSS_00931020;
  *(undefined1 *)&in_RDI[1].super_CommsInterface._vptr_CommsInterface = 1;
  *(undefined1 *)((long)&in_RDI[1].super_CommsInterface._vptr_CommsInterface + 1) = 0;
  std::__cxx11::string::string(unaff_retaddr);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3e28ba);
  return;
}

Assistant:

TcpCommsSS::TcpCommsSS() noexcept:
    NetworkCommsInterface(gmlc::networking::InterfaceTypes::TCP,
                          CommsInterface::thread_generation::single)
{
}